

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O2

void __thiscall ipx::LpSolver::RunMainIPM(LpSolver *this,IPM *ipm)

{
  double dVar1;
  Timer timer;
  KKTSolverBasis kkt;
  Timer local_260;
  KKTSolverBasis local_258;
  
  KKTSolverBasis::KKTSolverBasis
            (&local_258,&this->control_,
             (this->basis_)._M_t.super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>
             ._M_t.super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
             super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl);
  Timer::Timer(&local_260);
  ipm->maxiter_ = (this->control_).parameters_.super_ipx_parameters.ipm_maxiter;
  IPM::Driver(ipm,&local_258.super_KKTSolver,
              (this->iterate_)._M_t.
              super___uniq_ptr_impl<ipx::Iterate,_std::default_delete<ipx::Iterate>_>._M_t.
              super__Tuple_impl<0UL,_ipx::Iterate_*,_std::default_delete<ipx::Iterate>_>.
              super__Head_base<0UL,_ipx::Iterate_*,_false>._M_head_impl,&this->info_);
  dVar1 = Timer::Elapsed(&local_260);
  (this->info_).super_ipx_info.time_ipm2 = dVar1;
  KKTSolverBasis::~KKTSolverBasis(&local_258);
  return;
}

Assistant:

void LpSolver::RunMainIPM(IPM& ipm) {
    KKTSolverBasis kkt(control_, *basis_);
    Timer timer;
    ipm.maxiter(control_.ipm_maxiter());
    ipm.Driver(&kkt, iterate_.get(), &info_);
    info_.time_ipm2 = timer.Elapsed();
}